

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O3

void __thiscall Dashel::FileStream::FileStream(FileStream *this,void **vtt,string *targetName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  pointer pcVar3;
  int iVar4;
  string *psVar5;
  long *plVar6;
  DashelException *pDVar7;
  int *piVar8;
  size_type *psVar9;
  long *plVar10;
  string name;
  string mode;
  string errorMessage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"file","");
  pp_Var2 = (_func_int **)vtt[3];
  (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.
  _vptr_SelectableStream = pp_Var2;
  *(void **)((long)&(this->super_FileDescriptorStream).super_DisconnectableStream.
                    super_SelectableStream._vptr_SelectableStream + (long)pp_Var2[-3]) = vtt[4];
  (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.fd = -1;
  (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.writeOnly =
       false;
  (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.pollEvent = 1
  ;
  pp_Var2 = (_func_int **)vtt[2];
  (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.
  _vptr_SelectableStream = pp_Var2;
  *(void **)((long)&(this->super_FileDescriptorStream).super_DisconnectableStream.
                    super_SelectableStream._vptr_SelectableStream + (long)pp_Var2[-3]) = vtt[5];
  (this->super_FileDescriptorStream).super_DisconnectableStream.recvBufferPos = 0;
  (this->super_FileDescriptorStream).super_DisconnectableStream.recvBufferSize = 0;
  pp_Var2 = (_func_int **)vtt[1];
  (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.
  _vptr_SelectableStream = pp_Var2;
  *(void **)((long)&(this->super_FileDescriptorStream).super_DisconnectableStream.
                    super_SelectableStream._vptr_SelectableStream + (long)pp_Var2[-3]) = vtt[6];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pp_Var2 = (_func_int **)*vtt;
  (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.
  _vptr_SelectableStream = pp_Var2;
  *(void **)((long)&(this->super_FileDescriptorStream).super_DisconnectableStream.
                    super_SelectableStream._vptr_SelectableStream + (long)pp_Var2[-3]) = vtt[7];
  ParameterSet::add((ParameterSet *)
                    (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                      super_SelectableStream.field_0x30 +
                    (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                          super_SelectableStream._vptr_SelectableStream[-3]),
                    "file:name;mode=read;fd=-1");
  ParameterSet::add((ParameterSet *)
                    (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                      super_SelectableStream.field_0x30 +
                    (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                          super_SelectableStream._vptr_SelectableStream[-3]),
                    (targetName->_M_dataplus)._M_p);
  iVar4 = ParameterSet::get<int>
                    ((ParameterSet *)
                     (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                       super_SelectableStream.field_0x30 +
                     (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                           super_SelectableStream._vptr_SelectableStream[-3]),"fd");
  (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.fd = iVar4;
  if (-1 < iVar4) {
    ParameterSet::erase((ParameterSet *)
                        (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                          super_SelectableStream.field_0x30 +
                        (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                              super_SelectableStream._vptr_SelectableStream[-3]),"fd");
    return;
  }
  psVar5 = ParameterSet::get_abi_cxx11_
                     ((ParameterSet *)
                      (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                        super_SelectableStream.field_0x30 +
                      (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                            super_SelectableStream._vptr_SelectableStream[-3]),"name");
  pcVar3 = (psVar5->_M_dataplus)._M_p;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar3,pcVar3 + psVar5->_M_string_length);
  psVar5 = ParameterSet::get_abi_cxx11_
                     ((ParameterSet *)
                      (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                        super_SelectableStream.field_0x30 +
                      (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                            super_SelectableStream._vptr_SelectableStream[-3]),"mode");
  pcVar3 = (psVar5->_M_dataplus)._M_p;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + psVar5->_M_string_length);
  iVar4 = std::__cxx11::string::compare((char *)&local_d0);
  if (iVar4 == 0) {
    iVar4 = open(local_f0._M_dataplus._M_p,0);
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_d0);
    if (iVar4 == 0) {
      iVar4 = creat(local_f0._M_dataplus._M_p,0x1b0);
      (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.fd =
           iVar4;
      (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.writeOnly
           = true;
      goto LAB_001147e7;
    }
    iVar4 = std::__cxx11::string::compare((char *)&local_d0);
    if (iVar4 != 0) {
      pDVar7 = (DashelException *)__cxa_allocate_exception(0x20);
      DashelException::DashelException(pDVar7,InvalidTarget,0,"Invalid file mode.",(Stream *)0x0);
      __cxa_throw(pDVar7,&DashelException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = open(local_f0._M_dataplus._M_p,2);
  }
  (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.fd = iVar4;
LAB_001147e7:
  if (iVar4 != -1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::operator+(&local_70,"Cannot open file ",&local_f0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_90._M_dataplus._M_p = (pointer)*plVar6;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_90._M_dataplus._M_p == psVar9) {
    local_90.field_2._M_allocated_capacity = *psVar9;
    local_90.field_2._8_8_ = plVar6[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar9;
  }
  local_90._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::operator+(&local_50,&local_90,&local_d0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = (long *)*plVar6;
  plVar10 = plVar6 + 2;
  if (local_b0 == plVar10) {
    local_a0 = *plVar10;
    lStack_98 = plVar6[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar10;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pDVar7 = (DashelException *)__cxa_allocate_exception(0x20);
  piVar8 = __errno_location();
  DashelException::DashelException(pDVar7,ConnectionFailed,*piVar8,(char *)local_b0,(Stream *)0x0);
  __cxa_throw(pDVar7,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit FileStream(const string& targetName) :
			Stream("file"),
			FileDescriptorStream("file")
		{
			target.add("file:name;mode=read;fd=-1");
			target.add(targetName.c_str());
			fd = target.get<int>("fd");
			if (fd < 0)
			{
				const std::string name = target.get("name");
				const std::string mode = target.get("mode");

				// open file
				if (mode == "read")
					fd = open(name.c_str(), O_RDONLY);
				else if (mode == "write")
					fd = creat(name.c_str(), S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP), writeOnly = true;
				else if (mode == "readwrite")
					fd = open(name.c_str(), O_RDWR);
				else
					throw DashelException(DashelException::InvalidTarget, 0, "Invalid file mode.");
				if (fd == -1)
				{
					string errorMessage = "Cannot open file " + name + " for " + mode + ".";
					throw DashelException(DashelException::ConnectionFailed, errno, errorMessage.c_str());
				}
			}
			else
			{
				// remove file descriptor information from target name
				target.erase("fd");
			}
		}